

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O0

void __thiscall
YAJLHuffmanTable::HFTree::HFTree(HFTree *this,YAJLHuffmanTable *table,bitio_stream *bstream)

{
  void *pvVar1;
  ssize_t sVar2;
  HFNode *this_00;
  int local_c8;
  int local_c4;
  int i_2;
  int j_1;
  int in_count;
  int i_1;
  u32 count;
  int iStack_ac;
  u16 code;
  int j;
  int i;
  u8 *var_codes [16];
  u8 *ncodes;
  bitio_stream *bstream_local;
  YAJLHuffmanTable *table_local;
  HFTree *this_local;
  
  this->root = (HFNode *)0x0;
  this->marker_found = false;
  this->count_bstuff = false;
  this->bstuff_count = '\0';
  if (table != (YAJLHuffmanTable *)0x0) {
    var_codes[0xf] = table->ncodes;
    for (iStack_ac = 0; iStack_ac < 0x10; iStack_ac = iStack_ac + 1) {
      pvVar1 = operator_new__((ulong)var_codes[0xf][iStack_ac]);
      *(void **)(&j + (long)iStack_ac * 2) = pvVar1;
      count = 0;
      while( true ) {
        if ((int)(uint)var_codes[0xf][iStack_ac] <= (int)count) break;
        sVar2 = bitio::bitio_stream::read
                          (bstream,8,(void *)(long)iStack_ac,(ulong)var_codes[0xf][iStack_ac]);
        *(char *)(*(long *)(&j + (long)iStack_ac * 2) + (long)(int)count) = (char)sVar2;
        count = count + 1;
      }
    }
    i_1._2_2_ = 0;
    this_00 = (HFNode *)operator_new(0x18);
    HFNode::HFNode(this_00);
    this->root = this_00;
    for (j_1 = 0; j_1 < 0x10; j_1 = j_1 + 1) {
      i_2 = 0;
      for (local_c4 = 0; local_c4 < (int)(uint)var_codes[0xf][j_1]; local_c4 = local_c4 + 1) {
        insert(this,i_1._2_2_,(u8)j_1,*(u8 *)(*(long *)(&j + (long)j_1 * 2) + (long)i_2));
        i_2 = i_2 + 1;
        i_1._2_2_ = i_1._2_2_ + 1;
      }
      i_1._2_2_ = i_1._2_2_ << 1;
    }
    for (local_c8 = 0; local_c8 < 0x10; local_c8 = local_c8 + 1) {
      free(*(void **)(&j + (long)local_c8 * 2));
    }
  }
  return;
}

Assistant:

YAJLHuffmanTable::HFTree::HFTree(YAJLHuffmanTable *table, bitio::bitio_stream *bstream) {
    if (table == nullptr) {
        return;
    }



    auto ncodes = table->ncodes;
    u8 *var_codes[16];


    for (int i = 0; i < 16; i++) {
        var_codes[i] = new u8[ncodes[i]];
        for (int j = 0; j < ncodes[i]; j++) {
            var_codes[i][j] = bstream->read(0x8);
        }
    }

    u16 code = 0;
    u32 count = 0;
    root = new HFNode;

    // construct huffman-tree
    for (int i = 0; i < 16; i++) {
        auto in_count = 0;
        for (int j = 0; j < ncodes[i]; j++) {
            insert(code++, i, var_codes[i][in_count]);
            in_count++;
            count++;
        }
        code <<= 1;
    }

    for (int i = 0; i < 0x10; i++) {
        free(var_codes[i]);
    }
}